

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomThreeAction::Drop(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  itemType local_34;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BALL) {
    local_34 = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == BACKPACK) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,"You really dropped the ball this time. Way to go.",
                 (allocator *)&local_34);
      ActionResults::ActionResults(pAVar3,CURRENT,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pAVar3;
    }
  }
  pAVar3 = AbstractRoomAction::Drop(&this->super_AbstractRoomAction);
  return pAVar3;
}

Assistant:

ActionResults *BlueRoomThreeAction::Drop() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == BACKPACK) {
        return new ActionResults(CURRENT, "You really dropped the ball this time. Way to go.");
    } else {
        return AbstractRoomAction::Drop();
    }
}